

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O3

void anm_extract(anm_entry_t *entry,char *filename,uint version)

{
  anm_entry_t *paVar1;
  int iVar2;
  FILE *__s;
  uchar *__s_00;
  uchar *__ptr;
  thtx_header_t *ptVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint32_t uVar9;
  bool bVar10;
  image_t image;
  image_t image_1;
  image_t local_60;
  image_t local_48;
  
  local_60.width = 0;
  local_60.height = 0;
  local_60.format = 0xffffffff;
  util_total_entry_size(entry,&local_60.width,&local_60.height);
  uVar6 = local_60.width;
  uVar8 = local_60.height;
  if (local_60.height == 0 || local_60.width == 0) {
    return;
  }
  util_makepath(filename);
  if (option_dont_add_offset_border == 0) {
    bVar10 = entry->header->y != 0 || entry->header->x != 0;
  }
  else {
    bVar10 = false;
  }
  if (version != 0x13) {
LAB_0010e8c0:
    uVar7 = (ulong)(uVar8 * uVar6 * 4);
    __s_00 = (uchar *)malloc(uVar7);
    local_60.data = __s_00;
    memset(__s_00,0xff,uVar7);
    if (entry != (anm_entry_t *)0x0) {
      iVar2 = uVar6 * 4;
      do {
        lVar5 = 0;
        do {
          ptVar3 = entry->thtx;
          if ((&DAT_00139400)[lVar5] == (uint)ptVar3->format) {
            if (option_dont_add_offset_border == 0) {
              uVar9 = entry->header->y;
              uVar7 = (ulong)(entry->header->x << 2);
            }
            else {
              uVar7 = 0;
              uVar9 = 0;
            }
            if (version == 0x13) {
              png_read_mem(&local_48,entry->data,(ulong)ptVar3->size);
              __ptr = local_48.data;
            }
            else {
              __ptr = format_to_rgba(entry->data,(uint)ptVar3->h * (uint)ptVar3->w,
                                     (&DAT_00139400)[lVar5]);
            }
            ptVar3 = entry->thtx;
            if (uVar9 < ptVar3->h + uVar9) {
              uVar8 = iVar2 * uVar9;
              iVar4 = 0;
              uVar6 = uVar9;
              do {
                memcpy(__s_00 + uVar8 + uVar7,__ptr + iVar4 * (uint)ptVar3->w,(ulong)ptVar3->w << 2)
                ;
                uVar6 = uVar6 + 1;
                ptVar3 = entry->thtx;
                uVar8 = uVar8 + iVar2;
                iVar4 = iVar4 + 4;
              } while (uVar6 < ptVar3->h + uVar9);
            }
            free(__ptr);
            entry->processed = 1;
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != 5);
        entry = entry->next_by_name;
      } while (entry != (anm_entry_t *)0x0);
    }
    png_write(filename,&local_60);
    free(local_60.data);
    return;
  }
  ptVar3 = entry->thtx;
  if ((((0x1b < ptVar3->size) &&
       (lVar5._0_1_ = ptVar3[1].magic[0], lVar5._1_1_ = ptVar3[1].magic[1],
       lVar5._2_1_ = ptVar3[1].magic[2], lVar5._3_1_ = ptVar3[1].magic[3],
       lVar5._4_2_ = ptVar3[1].zero, lVar5._6_2_ = ptVar3[1].format, lVar5 == 0xa1a0a0d474e5089)) &&
      (ptVar3[1].size == 0x52444849)) && ((bVar10 || (entry->next_by_name != (anm_entry_t *)0x0))))
  {
    if (1 < option_verbose) {
      anm_extract_cold_3();
    }
    goto LAB_0010e8c0;
  }
  if (1 < option_verbose) {
    anm_extract_cold_1();
  }
  if (!bVar10) {
    paVar1 = entry->next_by_name;
    if (paVar1 == (anm_entry_t *)0x0) goto LAB_0010e85b;
    if (paVar1->next_by_name == (anm_entry_t *)0x0) {
      uVar6 = entry->thtx->size;
      if ((uVar6 == paVar1->thtx->size) &&
         (iVar2 = bcmp(entry->thtx + 1,paVar1->thtx + 1,(ulong)uVar6), iVar2 == 0))
      goto LAB_0010e85b;
    }
  }
  anm_extract_cold_2();
LAB_0010e85b:
  __s = fopen(filename,"wb");
  if (__s == (FILE *)0x0) {
    return;
  }
  fwrite(entry->thtx + 1,1,(ulong)entry->thtx->size,__s);
  fclose(__s);
  return;
}

Assistant:

static void
anm_extract(
    anm_entry_t* entry,
    const char* filename,
    unsigned version)
{
    const format_t formats[] = {
        FORMAT_GRAY8,
        FORMAT_ARGB4444,
        FORMAT_RGB565,
        FORMAT_BGRA8888,
        FORMAT_RGBA8888
    };
    image_t image;

    unsigned int f, y;

    image.width = 0;
    image.height = 0;
    image.format = FORMAT_RGBA8888;

    util_total_entry_size(entry, &image.width, &image.height);

    if (image.width == 0 || image.height == 0) {
        /* Then there's nothing to extract. */
        return;
    }

    util_makepath(filename);

    uint32_t ox = option_dont_add_offset_border ? 0 : entry->header->x;
    uint32_t oy = option_dont_add_offset_border ? 0 : entry->header->y;
    int is_png = 0;

    /* NEWHU: 19 */
    if (version == 19) {
        if (png_identify(entry->thtx->data, entry->thtx->size) &&
                (ox || oy || entry->next_by_name)) {
            if (option_verbose >= 2)
                fprintf(stderr, "%s: composing %s\n", argv0, filename);
            is_png = 1;
        } else {
            if (option_verbose >= 2)
                fprintf(stderr, "%s: not composing %s\n", argv0, filename);
            /* TH19's ability/dummy.png is used twice, but it's the same texture.
             * Avoid printing a warning in this particular case. */
            if (ox || oy || entry->next_by_name && (entry->next_by_name->next_by_name ||
                    entry->thtx->size != entry->next_by_name->thtx->size ||
                    memcmp(entry->thtx->data, entry->next_by_name->thtx->data, entry->thtx->size))) {
                fprintf(stderr, "%s: warning: %s can't be composed because it's a JPEG\n", argv0, filename);
            }
            FILE* stream = fopen(filename, "wb");
            if (stream) {
                fwrite(entry->thtx->data, 1, entry->thtx->size, stream);
                fclose(stream);
            }
            return;
        }
    }

    image.data = malloc(image.width * image.height * 4);
    /* XXX: Why 0xff? */
    memset(image.data, 0xff, image.width* image.height * 4);
    for (anm_entry_t *entryp = entry; entryp; entryp = entryp->next_by_name) {
        for (f = 0; f < sizeof(formats) / sizeof(formats[0]); ++f) {
            if (formats[f] == entryp->thtx->format) {
                ox = option_dont_add_offset_border ? 0 : entryp->header->x;
                oy = option_dont_add_offset_border ? 0 : entryp->header->y;
                unsigned char* temp_data = entry_to_rgba(entryp, is_png);
                for (y = oy; y < oy + entryp->thtx->h; ++y) {
                    memcpy(image.data + y * image.width * 4 + ox * 4,
                        temp_data + (y - oy) * entryp->thtx->w * 4,
                        entryp->thtx->w * 4);
                }
                free(temp_data);
                entryp->processed = 1;
            }
        }
    }

    png_write(filename, &image);
    free(image.data);
}